

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_data_zipx_ppmd(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  CPpmd8 *p_00;
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  Bool BVar5;
  int iVar6;
  wchar_t wVar7;
  byte *pbVar8;
  void *pvVar9;
  char *fmt;
  uint size_00;
  uchar *p;
  ulong uVar10;
  uint maxOrder;
  ssize_t bytes_avail;
  ssize_t local_38;
  
  pvVar3 = a->format->data;
  local_38 = 0;
  if (*(char *)((long)pvVar3 + 0xa1) != '\0') goto LAB_0010c7b5;
  if (*(char *)((long)pvVar3 + 0x1ec8) != '\0') {
    Ppmd8_Free((CPpmd8 *)((long)pvVar3 + 0x1e8));
    *(undefined1 *)((long)pvVar3 + 0x1ec8) = 0;
  }
  p_00 = (CPpmd8 *)((long)pvVar3 + 0x1e8);
  Ppmd8_Construct(p_00);
  *(undefined1 *)((long)pvVar3 + 0x1ec9) = 0;
  *(long *)((long)pvVar3 + 0x260) = (long)pvVar3 + 0x1d0;
  *(archive_read **)((long)pvVar3 + 0x1d0) = a;
  *(code **)((long)pvVar3 + 0x1d8) = ppmd_read;
  *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
  pbVar8 = (byte *)__archive_read_ahead(a,2,(ssize_t *)0x0);
  if (pbVar8 == (byte *)0x0) {
    bVar4 = false;
    archive_set_error(&a->archive,0x54,"Truncated file data in PPMd8 stream");
    wVar7 = L'\xffffffe2';
  }
  else {
    __archive_read_consume(a,2);
    bVar1 = pbVar8[1];
    bVar2 = *pbVar8;
    maxOrder = (bVar2 & 0xf) + 1;
    if (bVar1 < 0x30 && (bVar2 & 0xf) != 0) {
      size_00 = (((uint)bVar2 << 0x10 | (uint)bVar1 << 0x18) & 0xff00000) + 0x100000;
      BVar5 = Ppmd8_Alloc(p_00,size_00);
      if (BVar5 == 0) {
        archive_set_error(&a->archive,0xc,"Unable to allocate memory for PPMd8 stream: %u bytes",
                          (ulong)size_00);
      }
      else {
        *(undefined1 *)((long)pvVar3 + 0x1ec8) = 1;
        BVar5 = Ppmd8_RangeDec_Init(p_00);
        if (BVar5 == 0) {
          fmt = "PPMd8 stream range decoder initialization error";
          iVar6 = 0x16;
        }
        else {
          Ppmd8_Init(p_00,maxOrder,(uint)(bVar1 >> 4));
          free(*(void **)((long)pvVar3 + 0xa8));
          *(undefined8 *)((long)pvVar3 + 0xb0) = 0x40000;
          pvVar9 = malloc(0x40000);
          *(void **)((long)pvVar3 + 0xa8) = pvVar9;
          if (pvVar9 != (void *)0x0) {
            *(undefined1 *)((long)pvVar3 + 0xa1) = 1;
            *(long *)((long)pvVar3 + 0x80) =
                 *(long *)((long)pvVar3 + 0x80) + *(long *)((long)pvVar3 + 0x1e0) + 2;
            wVar7 = L'\0';
            bVar4 = true;
            goto LAB_0010c7ac;
          }
          fmt = "No memory for PPMd8 decompression";
          iVar6 = 0xc;
        }
        archive_set_error(&a->archive,iVar6,fmt);
      }
      bVar4 = false;
      wVar7 = L'\xffffffe2';
    }
    else {
      bVar4 = false;
      archive_set_error(&a->archive,0x54,
                        "Invalid parameter set in PPMd8 stream (order=%u, restore=%u)",
                        (ulong)maxOrder,(ulong)(uint)(bVar1 >> 4));
      wVar7 = L'\xffffffe7';
    }
  }
LAB_0010c7ac:
  if (!bVar4) {
    return wVar7;
  }
LAB_0010c7b5:
  __archive_read_ahead(a,1,&local_38);
  if (local_38 < 0) {
    archive_set_error(&a->archive,0x54,"Truncated PPMd8 file body");
LAB_0010c8c9:
    wVar7 = L'\xffffffe2';
  }
  else {
    *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
    uVar10 = 0;
    do {
      iVar6 = Ppmd8_DecodeSymbol((CPpmd8 *)((long)pvVar3 + 0x1e8));
      if (iVar6 < 0) {
        *(undefined1 *)((long)pvVar3 + 0xa2) = 1;
        iVar6 = 2;
      }
      else if (*(char *)((long)pvVar3 + 0x1ec9) == '\0') {
        *(char *)(*(long *)((long)pvVar3 + 0xa8) + uVar10) = (char)iVar6;
        uVar10 = uVar10 + 1;
        iVar6 = 0;
      }
      else {
        archive_set_error(&a->archive,0x54,"Truncated PPMd8 file body");
        iVar6 = 1;
      }
      if (iVar6 != 0) {
        if (iVar6 != 2) goto LAB_0010c8c9;
        break;
      }
    } while (uVar10 < *(ulong *)((long)pvVar3 + 0xb0));
    *(long *)((long)pvVar3 + 0x78) =
         *(long *)((long)pvVar3 + 0x78) - *(long *)((long)pvVar3 + 0x1e0);
    *(long *)((long)pvVar3 + 0x80) =
         *(long *)((long)pvVar3 + 0x80) + *(long *)((long)pvVar3 + 0x1e0);
    *(long *)((long)pvVar3 + 0x88) = *(long *)((long)pvVar3 + 0x88) + uVar10;
    if (*(char *)((long)pvVar3 + 0xa2) != '\0') {
      Ppmd8_Free((CPpmd8 *)((long)pvVar3 + 0x1e8));
      *(undefined1 *)((long)pvVar3 + 0x1ec8) = 0;
    }
    *buff = *(void **)((long)pvVar3 + 0xa8);
    *size = uVar10;
    wVar7 = L'\0';
  }
  return wVar7;
}

Assistant:

static int
zip_read_data_zipx_ppmd(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	size_t consumed_bytes = 0;
	ssize_t bytes_avail = 0;

	(void) offset; /* UNUSED */

	/* If we're here for the first time, initialize Ppmd8 decompression
	 * context first. */
	if(!zip->decompress_init) {
		ret = zipx_ppmd8_init(a, zip);
		if(ret != ARCHIVE_OK)
			return ret;
	}

	/* Fetch for more data. We're reading 1 byte here, but libarchive
	 * should prefetch more bytes. */
	(void) __archive_read_ahead(a, 1, &bytes_avail);
	if(bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated PPMd8 file body");
		return (ARCHIVE_FATAL);
	}

	/* This counter will be updated inside ppmd_read(), which at one
	 * point will be called by Ppmd8_DecodeSymbol. */
	zip->zipx_ppmd_read_compressed = 0;

	/* Decompression loop. */
	do {
		int sym = __archive_ppmd8_functions.Ppmd8_DecodeSymbol(
		    &zip->ppmd8);
		if(sym < 0) {
			zip->end_of_entry = 1;
			break;
		}

		/* This field is set by ppmd_read() when there was no more data
		 * to be read. */
		if(zip->ppmd8_stream_failed) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated PPMd8 file body");
			return (ARCHIVE_FATAL);
		}

		zip->uncompressed_buffer[consumed_bytes] = (uint8_t) sym;
		++consumed_bytes;
	} while(consumed_bytes < zip->uncompressed_buffer_size);

	/* Update pointers so we can continue decompression in another call. */
	zip->entry_bytes_remaining -= zip->zipx_ppmd_read_compressed;
	zip->entry_compressed_bytes_read += zip->zipx_ppmd_read_compressed;
	zip->entry_uncompressed_bytes_read += consumed_bytes;

	/* If we're at the end of stream, deinitialize Ppmd8 context. */
	if(zip->end_of_entry) {
		__archive_ppmd8_functions.Ppmd8_Free(&zip->ppmd8);
		zip->ppmd8_valid = 0;
	}

	/* Update pointers for libarchive. */
	*buff = zip->uncompressed_buffer;
	*size = consumed_bytes;

	return ARCHIVE_OK;
}